

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateTagged(Validator *this,uint8_t *ptr,size_t length)

{
  uint8_t *ptr_00;
  byte bVar1;
  Exception *this_00;
  size_t expected;
  Validator *this_01;
  long lVar2;
  long lVar3;
  
  bVar1 = *ptr;
  this_01 = this;
  do {
    lVar3 = 2;
    lVar2 = -2;
    expected = 3;
    if (bVar1 != 0xee) {
      if (bVar1 != 0xef) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_00,NotImplemented);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      expected = 10;
      lVar3 = 9;
      lVar2 = -9;
    }
    validateBufferLength(this_01,expected,length,true);
    ptr_00 = ptr + lVar3;
    length = length + lVar2;
    bVar1 = ptr[lVar3];
    ptr = ptr_00;
  } while ((bVar1 & 0xfe) == 0xee);
  validatePart(this,ptr_00,length,true);
  return;
}

Assistant:

void Validator::validateTagged(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  do {
    // looping here to skip over nested tags.
    if (head == 0xee) {
      // 1 byte tag type
      // the actual Slice (without tag) must be at least one byte long
      validateBufferLength(1 + 1 + 1, length, true);
      VELOCYPACK_ASSERT(length > 2);
      ptr += 2;
      length -= 2;
    } else if (head == 0xef) {
      // 8 bytes tag type
      // the actual Slice (without tag) must be at least one byte long
      validateBufferLength(1 + 8 + 1, length, true);
      VELOCYPACK_ASSERT(length > 9);
      ptr += 9;
      length -= 9;
    } else {
      throw Exception(Exception::NotImplemented);
    }
    VELOCYPACK_ASSERT(length > 0);
    head = *ptr;
  } while (head == 0xee || head == 0xef);

  validatePart(ptr, length, true);
}